

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O0

string * __thiscall pbrt::AtomicFloat::ToString_abi_cxx11_(AtomicFloat *this)

{
  string *in_RDI;
  float *unaff_retaddr;
  char *in_stack_00000008;
  
  operator_cast_to_float((AtomicFloat *)0x527c04);
  StringPrintf<float>(in_stack_00000008,unaff_retaddr);
  return in_RDI;
}

Assistant:

std::string AtomicFloat::ToString() const {
    return StringPrintf("%f", float(*this));
}